

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int fffvcl(fitsfile *fptr,int *nvarcols,int *colnums,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  bool bVar5;
  
  *nvarcols = 0;
  if (0 < *status) {
    return *status;
  }
  pFVar1 = fptr->Fptr;
  if (pFVar1->hdutype == 2) {
    if ((pFVar1->tableptr != (tcolumn *)0x0) && (iVar2 = pFVar1->tfield, 0 < iVar2)) {
      piVar3 = &pFVar1->tableptr->tdatatype;
      iVar4 = 1;
      do {
        if (*piVar3 < 0) {
          if (colnums != (int *)0x0) {
            colnums[*nvarcols] = iVar4;
          }
          *nvarcols = *nvarcols + 1;
        }
        piVar3 = piVar3 + 0x28;
        bVar5 = iVar4 != iVar2;
        iVar4 = iVar4 + 1;
      } while (bVar5);
    }
    iVar2 = *status;
  }
  else {
    ffpmsg("Var-length column search can only be performed on Binary tables (fffvcl)");
    *status = 0xe3;
    iVar2 = 0xe3;
  }
  return iVar2;
}

Assistant:

int fffvcl(fitsfile *fptr,   /* I - FITS file pointer                       */
           int *nvarcols,    /* O - Number of variable length columns found */
           int *colnums,     /* O - 1-based variable column positions       */
           int *status)      /* IO - error status                           */
{
/*
   Internal function to identify which columns in a binary table are variable length.
   The colnums array will be filled with nvarcols elements - the 1-based numbers
   of all variable length columns in the table.  This ASSUMES calling function
   has passed in a colnums array large enough to hold these (colnums==NULL also 
   allowed).
*/
   int tfields=0,icol;
   tcolumn *colptr=0;
   
   *nvarcols = 0;
   if (*status > 0)
       return(*status);
       
   if ((fptr->Fptr)->hdutype != BINARY_TBL)
   {
      ffpmsg("Var-length column search can only be performed on Binary tables (fffvcl)");
      return(*status = NOT_BTABLE);
   }
   
   if ((fptr->Fptr)->tableptr)
   {
      colptr = (fptr->Fptr)->tableptr;
      tfields = (fptr->Fptr)->tfield;
      for (icol=0; icol<tfields; ++icol, ++colptr)
      {
         /* Condition for variable length column: negative tdatatype */
         if (colptr->tdatatype < 0)
         {
	    if (colnums) colnums[*nvarcols] = icol + 1;
	    *nvarcols += 1;            
         }
      }      
   }   
   return(*status);
}